

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O3

void __thiscall
ROM::Description::Description<char_const*,std::initializer_list<unsigned_int>>
          (Description *this,Name name,string machine_name,string descriptive_name,char *file_names,
          size_t size,initializer_list<unsigned_int> crc32s)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_62;
  allocator_type local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->name = name;
  local_58 = &this->machine_name;
  local_60 = &(this->machine_name).field_2;
  (this->machine_name)._M_dataplus._M_p = (pointer)local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,*(long *)file_names,*(long *)(file_names + 8) + *(long *)file_names)
  ;
  (this->descriptive_name)._M_dataplus._M_p = (pointer)&(this->descriptive_name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->descriptive_name,*(long *)size,*(long *)(size + 8) + *(long *)size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(char *)crc32s._M_array,&local_62);
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names,__l,&local_61);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this->size = crc32s._M_len;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->crc32s,(initializer_list<unsigned_int>)machine_name._0_16_,
             (less<unsigned_int> *)&local_50,(allocator_type *)&local_62);
  if (((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
     ((this->crc32s)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color == _S_red)) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&(this->crc32s)._M_t);
  }
  return;
}

Assistant:

Description(
			Name name, std::string machine_name, std::string descriptive_name, FileNameT file_names, size_t size, CRC32T crc32s = uint32_t(0)
		) : name{name}, machine_name{machine_name}, descriptive_name{descriptive_name}, file_names{file_names}, size{size}, crc32s{crc32s} {
			// Slightly lazy: deal with the case where the constructor wasn't provided with any
			// CRCs by spotting that the set has exactly one member, which has value 0. The alternative
			// would be to provide a partial specialisation that never put anything into the set.
			if(this->crc32s.size() == 1 && !*this->crc32s.begin()) {
				this->crc32s.clear();
			}
		}